

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack4.h
# Opt level: O0

void ncnn::padding_reflect_pack4_sse(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  undefined8 uVar1;
  int in_ECX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_R9D;
  __m128 _p_8;
  int x_8;
  __m128 _p_7;
  int x_7;
  __m128 _p_6;
  int x_6;
  float *ptr0_1;
  int y_2;
  __m128 _p_5;
  int x_5;
  __m128 _p_4;
  int x_4;
  __m128 _p_3;
  int x_3;
  int y_1;
  __m128 _p_2;
  int x_2;
  __m128 _p_1;
  int x_1;
  __m128 _p;
  int x;
  float *ptr0;
  int y;
  float *outptr;
  float *ptr;
  int local_2ac;
  int local_28c;
  int local_26c;
  float *local_268;
  int local_25c;
  int local_23c;
  int local_21c;
  int local_200;
  int local_1fc;
  int local_1dc;
  int local_1bc;
  int local_1a4;
  float *local_1a0;
  int local_194;
  float *local_190;
  float *local_188;
  
  local_188 = Mat::operator_cast_to_float_(in_RDI);
  local_190 = Mat::operator_cast_to_float_(in_RSI);
  local_188 = local_188 + in_EDX * in_RDI->w * 4;
  for (local_194 = 0; local_194 < in_EDX; local_194 = local_194 + 1) {
    local_1a0 = local_188;
    for (local_1a4 = 0; local_1a4 < in_R8D; local_1a4 = local_1a4 + 1) {
      uVar1 = *(undefined8 *)(local_188 + (in_R8D - local_1a4) * 4 + 2);
      *(undefined8 *)local_190 = *(undefined8 *)(local_188 + (in_R8D - local_1a4) * 4);
      *(undefined8 *)(local_190 + 2) = uVar1;
      local_190 = local_190 + 4;
    }
    for (local_1bc = 0; local_1bc < in_RDI->w; local_1bc = local_1bc + 1) {
      uVar1 = *(undefined8 *)(local_1a0 + 2);
      *(undefined8 *)local_190 = *(undefined8 *)local_1a0;
      *(undefined8 *)(local_190 + 2) = uVar1;
      local_1a0 = local_1a0 + 4;
      local_190 = local_190 + 4;
    }
    for (local_1dc = 0; local_1dc < in_R9D; local_1dc = local_1dc + 1) {
      uVar1 = *(undefined8 *)(local_1a0 + (-8 - (long)(local_1dc << 2)) + 2);
      *(undefined8 *)local_190 = *(undefined8 *)(local_1a0 + (-8 - (long)(local_1dc << 2)));
      *(undefined8 *)(local_190 + 2) = uVar1;
      local_190 = local_190 + 4;
    }
    local_188 = local_188 + -(long)(in_RDI->w << 2);
  }
  for (local_1fc = 0; local_1fc < in_RDI->h; local_1fc = local_1fc + 1) {
    for (local_200 = 0; local_200 < in_R8D; local_200 = local_200 + 1) {
      uVar1 = *(undefined8 *)(local_188 + (in_R8D - local_200) * 4 + 2);
      *(undefined8 *)local_190 = *(undefined8 *)(local_188 + (in_R8D - local_200) * 4);
      *(undefined8 *)(local_190 + 2) = uVar1;
      local_190 = local_190 + 4;
    }
    for (local_21c = 0; local_21c < in_RDI->w; local_21c = local_21c + 1) {
      uVar1 = *(undefined8 *)(local_188 + 2);
      *(undefined8 *)local_190 = *(undefined8 *)local_188;
      *(undefined8 *)(local_190 + 2) = uVar1;
      local_188 = local_188 + 4;
      local_190 = local_190 + 4;
    }
    for (local_23c = 0; local_23c < in_R9D; local_23c = local_23c + 1) {
      uVar1 = *(undefined8 *)(local_188 + (-8 - (long)(local_23c << 2)) + 2);
      *(undefined8 *)local_190 = *(undefined8 *)(local_188 + (-8 - (long)(local_23c << 2)));
      *(undefined8 *)(local_190 + 2) = uVar1;
      local_190 = local_190 + 4;
    }
  }
  local_188 = local_188 + -(long)(in_RDI->w << 3);
  for (local_25c = 0; local_25c < in_ECX; local_25c = local_25c + 1) {
    local_268 = local_188;
    for (local_26c = 0; local_26c < in_R8D; local_26c = local_26c + 1) {
      uVar1 = *(undefined8 *)(local_188 + (in_R8D - local_26c) * 4 + 2);
      *(undefined8 *)local_190 = *(undefined8 *)(local_188 + (in_R8D - local_26c) * 4);
      *(undefined8 *)(local_190 + 2) = uVar1;
      local_190 = local_190 + 4;
    }
    for (local_28c = 0; local_28c < in_RDI->w; local_28c = local_28c + 1) {
      uVar1 = *(undefined8 *)(local_268 + 2);
      *(undefined8 *)local_190 = *(undefined8 *)local_268;
      *(undefined8 *)(local_190 + 2) = uVar1;
      local_268 = local_268 + 4;
      local_190 = local_190 + 4;
    }
    for (local_2ac = 0; local_2ac < in_R9D; local_2ac = local_2ac + 1) {
      uVar1 = *(undefined8 *)(local_268 + (-8 - (long)(local_2ac << 2)) + 2);
      *(undefined8 *)local_190 = *(undefined8 *)(local_268 + (-8 - (long)(local_2ac << 2)));
      *(undefined8 *)(local_190 + 2) = uVar1;
      local_190 = local_190 + 4;
    }
    local_188 = local_188 + -(long)(in_RDI->w << 2);
  }
  return;
}

Assistant:

static void padding_reflect_pack4_sse(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    const float* ptr = src;
    float* outptr = dst;

    // fill top
    ptr += top * src.w * 4;
    for (int y = 0; y < top; y++)
    {
        const float* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            __m128 _p = _mm_loadu_ps(ptr0 + (left - x) * 4);
            _mm_storeu_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _mm_storeu_ps(outptr, _p);
            ptr0 += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            __m128 _p = _mm_loadu_ps(ptr0 - 8 - x * 4);
            _mm_storeu_ps(outptr, _p);
            outptr += 4;
        }
        ptr -= src.w * 4;
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        for (int x = 0; x < left; x++)
        {
            __m128 _p = _mm_loadu_ps(ptr + (left - x) * 4);
            _mm_storeu_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            __m128 _p = _mm_loadu_ps(ptr - 8 - x * 4);
            _mm_storeu_ps(outptr, _p);
            outptr += 4;
        }
    }
    // fill bottom
    ptr -= 2 * src.w * 4;
    for (int y = 0; y < bottom; y++)
    {
        const float* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            __m128 _p = _mm_loadu_ps(ptr0 + (left - x) * 4);
            _mm_storeu_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _mm_storeu_ps(outptr, _p);
            ptr0 += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            __m128 _p = _mm_loadu_ps(ptr0 - 8 - x * 4);
            _mm_storeu_ps(outptr, _p);
            outptr += 4;
        }
        ptr -= src.w * 4;
    }
}